

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t1load.c
# Opt level: O3

void parse_subrs(T1_Face face,T1_Loader loader)

{
  FT_Memory memory;
  undefined8 *puVar1;
  FT_UInt FVar2;
  int iVar3;
  ulong uVar4;
  FT_Byte *pFVar5;
  size_t sVar6;
  FT_Pointer __dest;
  FT_Hash hash;
  ulong uVar7;
  size_t data;
  FT_Error error;
  FT_Byte *base;
  int local_64;
  FT_Memory local_60;
  PS_Table local_58;
  FT_Byte *local_50;
  FT_UInt local_48;
  undefined4 uStack_44;
  undefined8 *local_40;
  ulong local_38;
  
  memory = (loader->parser).root.memory;
  puVar1 = (undefined8 *)face->psaux;
  (*(loader->parser).root.funcs.skip_spaces)((PS_Parser)loader);
  pFVar5 = (loader->parser).root.cursor;
  if ((pFVar5 < (loader->parser).root.limit) && (*pFVar5 == '[')) {
    (*(loader->parser).root.funcs.skip_PS_token)((PS_Parser)loader);
    (*(loader->parser).root.funcs.skip_spaces)((PS_Parser)loader);
    pFVar5 = (loader->parser).root.cursor;
    if ((pFVar5 < (loader->parser).root.limit) && (*pFVar5 == ']')) {
      return;
    }
LAB_00178706:
    (loader->parser).root.error = 3;
    return;
  }
  uVar4 = (*(loader->parser).root.funcs.to_int)((PS_Parser)loader);
  if ((int)(uint)uVar4 < 0) goto LAB_00178706;
  pFVar5 = (loader->parser).root.limit;
  if (((loader->parser).root.cursor <= pFVar5) &&
     (uVar7 = (long)pFVar5 - (long)(loader->parser).root.cursor >> 3,
     (long)uVar7 < (long)(ulong)((uint)uVar4 & 0x7fffffff))) {
    if (loader->subrs_hash == (FT_Hash)0x0) {
      hash = (FT_Hash)ft_mem_alloc(memory,0x28,&local_64);
      loader->subrs_hash = hash;
      if (local_64 != 0) goto LAB_00178775;
      local_64 = ft_hash_num_init(hash,memory);
      uVar4 = uVar7 & 0xffffffff;
      if (local_64 != 0) goto LAB_00178775;
    }
    else {
      uVar4 = uVar7 & 0xffffffff;
    }
  }
  (*(loader->parser).root.funcs.skip_PS_token)((PS_Parser)loader);
  if ((loader->parser).root.error != 0) {
    return;
  }
  (*(loader->parser).root.funcs.skip_spaces)((PS_Parser)loader);
  if ((loader->num_subrs != 0) ||
     (local_64 = (**(code **)*puVar1)(&loader->subrs,uVar4 & 0xffffffff,memory), local_64 == 0)) {
    pFVar5 = (loader->parser).root.cursor;
    local_38 = uVar4;
    if (pFVar5 + 4 < (loader->parser).root.limit) {
      data = 0;
      local_60 = memory;
      local_58 = &loader->subrs;
      local_40 = puVar1;
      do {
        if (((*pFVar5 != 'd') || (pFVar5[1] != 'u')) || (pFVar5[2] != 'p')) break;
        (*(loader->parser).root.funcs.skip_PS_token)((PS_Parser)loader);
        sVar6 = (*(loader->parser).root.funcs.to_int)((PS_Parser)loader);
        iVar3 = read_binary_data(&loader->parser,(FT_ULong *)&local_48,&local_50,
                                 ((face->root).internal)->incremental_interface !=
                                 (FT_Incremental_InterfaceRec *)0x0);
        if (iVar3 == 0) {
          return;
        }
        (*(loader->parser).root.funcs.skip_PS_token)((PS_Parser)loader);
        if ((loader->parser).root.error != 0) {
          return;
        }
        (*(loader->parser).root.funcs.skip_spaces)((PS_Parser)loader);
        pFVar5 = (loader->parser).root.cursor;
        if (((pFVar5 + 4 < (loader->parser).root.limit) && (*pFVar5 == 'p')) &&
           ((pFVar5[1] == 'u' && (pFVar5[2] == 't')))) {
          (*(loader->parser).root.funcs.skip_PS_token)((PS_Parser)loader);
          (*(loader->parser).root.funcs.skip_spaces)((PS_Parser)loader);
        }
        if (loader->subrs_hash != (FT_Hash)0x0) {
          ft_hash_num_insert((FT_Int)sVar6,data,loader->subrs_hash,local_60);
          sVar6 = data;
        }
        FVar2 = local_48;
        if (loader->num_subrs == 0) {
          uVar4 = (ulong)(face->type1).private_dict.lenIV;
          if ((long)uVar4 < 0) {
            local_64 = (*(loader->subrs).funcs.add)(local_58,(FT_Int)sVar6,local_50,local_48);
          }
          else {
            uVar7 = CONCAT44(uStack_44,local_48);
            if (uVar7 < uVar4) {
              local_64 = 3;
              goto LAB_00178775;
            }
            __dest = ft_mem_alloc(local_60,uVar7,&local_64);
            if (local_64 != 0) goto LAB_00178775;
            memcpy(__dest,local_50,uVar7);
            (*(code *)local_40[4])(__dest,uVar7,0x10ea);
            iVar3 = (face->type1).private_dict.lenIV;
            local_64 = (*(loader->subrs).funcs.add)
                                 (local_58,(FT_Int)sVar6,(void *)((long)__dest + (long)iVar3),
                                  FVar2 - iVar3);
            ft_mem_free(local_60,__dest);
          }
          if (local_64 != 0) goto LAB_00178775;
        }
        data = (size_t)((int)data + 1);
        pFVar5 = (loader->parser).root.cursor;
      } while (pFVar5 + 4 < (loader->parser).root.limit);
    }
    if (loader->num_subrs != 0) {
      return;
    }
    loader->num_subrs = (FT_Int)local_38;
    return;
  }
LAB_00178775:
  (loader->parser).root.error = local_64;
  return;
}

Assistant:

static void
  parse_subrs( T1_Face    face,
               T1_Loader  loader )
  {
    T1_Parser  parser = &loader->parser;
    PS_Table   table  = &loader->subrs;
    FT_Memory  memory = parser->root.memory;
    FT_Error   error;
    FT_Int     num_subrs;
    FT_UInt    count;

    PSAux_Service  psaux = (PSAux_Service)face->psaux;


    T1_Skip_Spaces( parser );

    /* test for empty array */
    if ( parser->root.cursor < parser->root.limit &&
         *parser->root.cursor == '['              )
    {
      T1_Skip_PS_Token( parser );
      T1_Skip_Spaces  ( parser );
      if ( parser->root.cursor >= parser->root.limit ||
           *parser->root.cursor != ']'               )
        parser->root.error = FT_THROW( Invalid_File_Format );
      return;
    }

    num_subrs = (FT_Int)T1_ToInt( parser );
    if ( num_subrs < 0 )
    {
      parser->root.error = FT_THROW( Invalid_File_Format );
      return;
    }

    /* we certainly need more than 8 bytes per subroutine */
    if ( parser->root.limit >= parser->root.cursor                     &&
         num_subrs > ( parser->root.limit - parser->root.cursor ) >> 3 )
    {
      /*
       * There are two possibilities.  Either the font contains an invalid
       * value for `num_subrs', or we have a subsetted font where the
       * subroutine indices are not adjusted, e.g.
       *
       *   /Subrs 812 array
       *     dup 0 { ... } NP
       *     dup 51 { ... } NP
       *     dup 681 { ... } NP
       *   ND
       *
       * In both cases, we use a number hash that maps from subr indices to
       * actual array elements.
       */

      FT_TRACE0(( "parse_subrs: adjusting number of subroutines"
                  " (from %d to %d)\n",
                  num_subrs,
                  ( parser->root.limit - parser->root.cursor ) >> 3 ));
      num_subrs = ( parser->root.limit - parser->root.cursor ) >> 3;

      if ( !loader->subrs_hash )
      {
        if ( FT_NEW( loader->subrs_hash ) )
          goto Fail;

        error = ft_hash_num_init( loader->subrs_hash, memory );
        if ( error )
          goto Fail;
      }
    }

    /* position the parser right before the `dup' of the first subr */
    T1_Skip_PS_Token( parser );         /* `array' */
    if ( parser->root.error )
      return;
    T1_Skip_Spaces( parser );

    /* initialize subrs array -- with synthetic fonts it is possible */
    /* we get here twice                                             */
    if ( !loader->num_subrs )
    {
      error = psaux->ps_table_funcs->init( table, num_subrs, memory );
      if ( error )
        goto Fail;
    }

    /* the format is simple:   */
    /*                         */
    /*   `index' + binary data */
    /*                         */
    for ( count = 0; ; count++ )
    {
      FT_Long   idx;
      FT_ULong  size;
      FT_Byte*  base;


      /* If we are out of data, or if the next token isn't `dup', */
      /* we are done.                                             */
      if ( parser->root.cursor + 4 >= parser->root.limit          ||
          ft_strncmp( (char*)parser->root.cursor, "dup", 3 ) != 0 )
        break;

      T1_Skip_PS_Token( parser );       /* `dup' */

      idx = T1_ToInt( parser );

      if ( !read_binary_data( parser, &size, &base, IS_INCREMENTAL ) )
        return;

      /* The binary string is followed by one token, e.g. `NP' */
      /* (bound to `noaccess put') or by two separate tokens:  */
      /* `noaccess' & `put'.  We position the parser right     */
      /* before the next `dup', if any.                        */
      T1_Skip_PS_Token( parser );   /* `NP' or `|' or `noaccess' */
      if ( parser->root.error )
        return;
      T1_Skip_Spaces  ( parser );

      if ( parser->root.cursor + 4 < parser->root.limit            &&
           ft_strncmp( (char*)parser->root.cursor, "put", 3 ) == 0 )
      {
        T1_Skip_PS_Token( parser ); /* skip `put' */
        T1_Skip_Spaces  ( parser );
      }

      /* if we use a hash, the subrs index is the key, and a running */
      /* counter specified for `T1_Add_Table' acts as the value      */
      if ( loader->subrs_hash )
      {
        ft_hash_num_insert( idx, count, loader->subrs_hash, memory );
        idx = count;
      }

      /* with synthetic fonts it is possible we get here twice */
      if ( loader->num_subrs )
        continue;

      /* some fonts use a value of -1 for lenIV to indicate that */
      /* the charstrings are unencoded                           */
      /*                                                         */
      /* thanks to Tom Kacvinsky for pointing this out           */
      /*                                                         */
      if ( face->type1.private_dict.lenIV >= 0 )
      {
        FT_Byte*  temp = NULL;


        /* some fonts define empty subr records -- this is not totally */
        /* compliant to the specification (which says they should at   */
        /* least contain a `return'), but we support them anyway       */
        if ( size < (FT_ULong)face->type1.private_dict.lenIV )
        {
          error = FT_THROW( Invalid_File_Format );
          goto Fail;
        }

        /* t1_decrypt() shouldn't write to base -- make temporary copy */
        if ( FT_ALLOC( temp, size ) )
          goto Fail;
        FT_MEM_COPY( temp, base, size );
        psaux->t1_decrypt( temp, size, 4330 );
        size -= (FT_ULong)face->type1.private_dict.lenIV;
        error = T1_Add_Table( table, (FT_Int)idx,
                              temp + face->type1.private_dict.lenIV, size );
        FT_FREE( temp );
      }
      else
        error = T1_Add_Table( table, (FT_Int)idx, base, size );
      if ( error )
        goto Fail;
    }

    if ( !loader->num_subrs )
      loader->num_subrs = num_subrs;

    return;

  Fail:
    parser->root.error = error;
  }